

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::RegexCompile::createSetForProperty(RegexCompile *this,UnicodeString *propName,UBool negated)

{
  bool bVar1;
  UBool UVar2;
  int8_t iVar3;
  int32_t iVar4;
  UnicodeSet *pUVar5;
  UnicodeSet *pUVar6;
  ConstChar16Ptr *pCVar7;
  UnicodeSet *local_3e8;
  UnicodeSet *local_3a8;
  UnicodeSet *local_360;
  UnicodeSet *local_340;
  UnicodeSet *local_320;
  UnicodeSet *local_2f8;
  UnicodeSet local_2e8;
  ConstChar16Ptr local_290;
  ConstChar16Ptr local_288;
  ConstChar16Ptr local_280;
  ConstChar16Ptr local_278;
  ConstChar16Ptr local_270;
  ConstChar16Ptr local_268;
  ConstChar16Ptr local_260;
  ConstChar16Ptr local_258;
  ConstChar16Ptr local_250;
  ConstChar16Ptr local_248;
  ConstChar16Ptr local_240;
  ConstChar16Ptr local_238;
  ConstChar16Ptr local_230;
  ConstChar16Ptr local_228;
  ConstChar16Ptr local_220;
  ConstChar16Ptr local_218;
  ConstChar16Ptr local_210;
  ConstChar16Ptr local_208;
  undefined1 local_1f9;
  UnicodeSet *local_1f8;
  ConstChar16Ptr local_1f0;
  undefined1 local_1e1;
  UnicodeSet *local_1e0;
  ConstChar16Ptr local_1d8;
  ConstChar16Ptr local_1d0;
  ConstChar16Ptr local_1c8;
  ConstChar16Ptr local_1c0;
  ConstChar16Ptr local_1b8;
  UnicodeString local_1b0;
  undefined1 local_170 [8];
  UnicodeString blockName;
  ConstChar16Ptr local_120;
  undefined1 local_118 [8];
  UnicodeString mPropName;
  ConstChar16Ptr local_c8;
  undefined1 local_b9;
  UnicodeSet *local_b8;
  ConstChar16Ptr local_b0;
  undefined4 local_a8;
  undefined1 local_a1;
  UnicodeSet *local_a0;
  ConstChar16Ptr local_98;
  ConstChar16Ptr local_90;
  uint local_88;
  uint32_t usetFlags;
  undefined1 local_78 [8];
  UnicodeString setExpr;
  UErrorCode status;
  LocalPointer<icu_63::UnicodeSet> set;
  UBool negated_local;
  UnicodeString *propName_local;
  RegexCompile *this_local;
  
  set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._7_1_ = negated;
  UVar2 = ::U_FAILURE(*this->fStatus);
  if (UVar2 == '\0') {
    LocalPointer<icu_63::UnicodeSet>::LocalPointer
              ((LocalPointer<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0,(UnicodeSet *)0x0);
    setExpr.fUnion._52_4_ = 0;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78);
    local_88 = 0;
    ConstChar16Ptr::ConstChar16Ptr(&local_90,L"[\\p{");
    icu_63::UnicodeString::append((UnicodeString *)local_78,&local_90,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_90);
    icu_63::UnicodeString::append((UnicodeString *)local_78,propName);
    ConstChar16Ptr::ConstChar16Ptr(&local_98,L"}]");
    pCVar7 = &local_98;
    icu_63::UnicodeString::append((UnicodeString *)local_78,pCVar7,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_98);
    if ((this->fModeFlags & 2U) != 0) {
      local_88 = local_88 | 2;
    }
    pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar7);
    local_a1 = 0;
    local_2f8 = (UnicodeSet *)0x0;
    if (pUVar5 != (UnicodeSet *)0x0) {
      local_a1 = 1;
      local_a0 = pUVar5;
      UnicodeSet::UnicodeSet
                (pUVar5,(UnicodeString *)local_78,local_88,(SymbolTable *)0x0,
                 (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
      local_2f8 = pUVar5;
    }
    LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
              ((LocalPointer<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0,local_2f8,
               (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
    UVar2 = ::U_SUCCESS(setExpr.fUnion._52_4_);
    if ((UVar2 == '\0') && (setExpr.fUnion._52_4_ != 7)) {
      setExpr.fUnion._52_4_ = 0;
      ConstChar16Ptr::ConstChar16Ptr(&local_b0,L"word");
      pCVar7 = &local_b0;
      iVar3 = icu_63::UnicodeString::caseCompare(propName,pCVar7,-1,0);
      ConstChar16Ptr::~ConstChar16Ptr(&local_b0);
      if (iVar3 == '\0') {
        pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar7);
        local_b9 = 0;
        local_320 = (UnicodeSet *)0x0;
        if (pUVar5 != (UnicodeSet *)0x0) {
          local_b9 = 1;
          local_b8 = pUVar5;
          UnicodeSet::UnicodeSet(pUVar5,this->fRXPat->fStaticSets[1]);
          local_320 = pUVar5;
        }
        LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
                  ((LocalPointer<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0,local_320,
                   (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
        local_a8 = 2;
      }
      else {
        ConstChar16Ptr::ConstChar16Ptr(&local_c8,L"all");
        pCVar7 = &local_c8;
        iVar3 = icu_63::UnicodeString::compare(propName,pCVar7,-1);
        ConstChar16Ptr::~ConstChar16Ptr(&local_c8);
        if (iVar3 == '\0') {
          pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar7);
          mPropName.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 0;
          local_340 = (UnicodeSet *)0x0;
          if (pUVar5 != (UnicodeSet *)0x0) {
            mPropName.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 1;
            UnicodeSet::UnicodeSet(pUVar5,0,0x10ffff);
            local_340 = pUVar5;
          }
          LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
                    ((LocalPointer<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0,local_340,
                     (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
          local_a8 = 2;
        }
        else {
          icu_63::UnicodeString::UnicodeString((UnicodeString *)local_118,propName);
          ConstChar16Ptr::ConstChar16Ptr(&local_120,L"In");
          pCVar7 = &local_120;
          UVar2 = icu_63::UnicodeString::startsWith((UnicodeString *)local_118,pCVar7,2);
          bVar1 = false;
          if (UVar2 != '\0') {
            iVar4 = icu_63::UnicodeString::length((UnicodeString *)local_118);
            bVar1 = 2 < iVar4;
          }
          ConstChar16Ptr::~ConstChar16Ptr(&local_120);
          if (bVar1) {
            setExpr.fUnion._52_4_ = 0;
            pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar7);
            blockName.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 0;
            local_360 = (UnicodeSet *)0x0;
            if (pUVar5 != (UnicodeSet *)0x0) {
              blockName.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 1;
              UnicodeSet::UnicodeSet(pUVar5);
              local_360 = pUVar5;
            }
            LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
                      ((LocalPointer<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0,local_360,
                       (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
            UVar2 = ::U_FAILURE(setExpr.fUnion._52_4_);
            if (UVar2 == '\0') {
              icu_63::UnicodeString::UnicodeString
                        ((UnicodeString *)local_170,(UnicodeString *)local_118,2);
              pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                 ((LocalPointerBase<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0);
              icu_63::UnicodeString::UnicodeString(&local_1b0,L"Block");
              UnicodeSet::applyPropertyAlias
                        (pUVar5,&local_1b0,(UnicodeString *)local_170,
                         (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
              icu_63::UnicodeString::~UnicodeString(&local_1b0);
              local_a8 = 2;
              icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_170);
            }
            else {
              local_a8 = 2;
            }
          }
          else {
            ConstChar16Ptr::ConstChar16Ptr(&local_1b8,L"Is");
            UVar2 = icu_63::UnicodeString::startsWith(propName,&local_1b8,2);
            bVar1 = false;
            if (UVar2 != '\0') {
              iVar4 = icu_63::UnicodeString::length(propName);
              bVar1 = 2 < iVar4;
            }
            ConstChar16Ptr::~ConstChar16Ptr(&local_1b8);
            if (bVar1) {
              icu_63::UnicodeString::remove((UnicodeString *)local_118,(char *)0x0);
              iVar4 = icu_63::UnicodeString::indexOf((UnicodeString *)local_118,L'=');
              if (iVar4 < 0) {
                ConstChar16Ptr::ConstChar16Ptr(&local_1c0,L"assigned");
                iVar3 = icu_63::UnicodeString::caseCompare
                                  ((UnicodeString *)local_118,&local_1c0,-1,0);
                ConstChar16Ptr::~ConstChar16Ptr(&local_1c0);
                if (iVar3 == '\0') {
                  icu_63::UnicodeString::setTo((UnicodeString *)local_118,L"unassigned",-1);
                  set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._7_1_ =
                       (set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._7_1_ != 0 ^ 0xffU) & 1;
                }
                else {
                  ConstChar16Ptr::ConstChar16Ptr(&local_1c8,L"TitleCase");
                  iVar3 = icu_63::UnicodeString::caseCompare
                                    ((UnicodeString *)local_118,&local_1c8,-1,0);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_1c8);
                  if (iVar3 == '\0') {
                    icu_63::UnicodeString::setTo((UnicodeString *)local_118,L"Titlecase_Letter",-1);
                  }
                }
                ConstChar16Ptr::ConstChar16Ptr(&local_1d0,L"[\\p{");
                icu_63::UnicodeString::insert((UnicodeString *)local_118,0,&local_1d0,-1);
                ConstChar16Ptr::~ConstChar16Ptr(&local_1d0);
                ConstChar16Ptr::ConstChar16Ptr(&local_1d8,L"}]");
                pCVar7 = &local_1d8;
                icu_63::UnicodeString::append((UnicodeString *)local_118,pCVar7,-1);
                ConstChar16Ptr::~ConstChar16Ptr(&local_1d8);
                pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar7);
                local_1e1 = 0;
                local_3a8 = (UnicodeSet *)0x0;
                if (pUVar5 != (UnicodeSet *)0x0) {
                  local_1e1 = 1;
                  local_1e0 = pUVar5;
                  UnicodeSet::UnicodeSet(pUVar5,(UnicodeString *)local_118,this->fStatus);
                  local_3a8 = pUVar5;
                }
                LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
                          ((LocalPointer<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0,local_3a8,
                           (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                UVar2 = ::U_SUCCESS(setExpr.fUnion._52_4_);
                if (UVar2 != '\0') {
                  pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                     ((LocalPointerBase<icu_63::UnicodeSet> *)
                                      &stack0xffffffffffffffd0);
                  UVar2 = UnicodeSet::isEmpty(pUVar5);
                  if ((UVar2 == '\0') && ((local_88 & 2) != 0)) {
                    pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                       ((LocalPointerBase<icu_63::UnicodeSet> *)
                                        &stack0xffffffffffffffd0);
                    UnicodeSet::closeOver(pUVar5,2);
                  }
                }
                local_a8 = 2;
              }
              else {
                setExpr.fUnion._52_4_ = 0x10304;
                local_a8 = 2;
              }
            }
            else {
              ConstChar16Ptr::ConstChar16Ptr(&local_1f0,L"java");
              pCVar7 = &local_1f0;
              UVar2 = icu_63::UnicodeString::startsWith(propName,pCVar7,-1);
              ConstChar16Ptr::~ConstChar16Ptr(&local_1f0);
              if (UVar2 == '\0') {
                setExpr.fUnion._52_4_ = 0x10304;
                local_a8 = 0;
              }
              else {
                setExpr.fUnion._52_4_ = 0;
                pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pCVar7);
                local_1f9 = 0;
                local_3e8 = (UnicodeSet *)0x0;
                if (pUVar5 != (UnicodeSet *)0x0) {
                  local_1f9 = 1;
                  local_1f8 = pUVar5;
                  UnicodeSet::UnicodeSet(pUVar5);
                  local_3e8 = pUVar5;
                }
                LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
                          ((LocalPointer<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0,local_3e8,
                           (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                UVar2 = ::U_FAILURE(setExpr.fUnion._52_4_);
                if (UVar2 == '\0') {
                  ConstChar16Ptr::ConstChar16Ptr(&local_208,L"javaDefined");
                  iVar3 = icu_63::UnicodeString::compare(propName,&local_208,-1);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_208);
                  if (iVar3 == '\0') {
                    pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                       ((LocalPointerBase<icu_63::UnicodeSet> *)
                                        &stack0xffffffffffffffd0);
                    addCategory(pUVar5,1,(UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19))
                    ;
                    pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                       ((LocalPointerBase<icu_63::UnicodeSet> *)
                                        &stack0xffffffffffffffd0);
                    UnicodeSet::complement(pUVar5);
                  }
                  else {
                    ConstChar16Ptr::ConstChar16Ptr(&local_210,L"javaDigit");
                    iVar3 = icu_63::UnicodeString::compare(propName,&local_210,-1);
                    ConstChar16Ptr::~ConstChar16Ptr(&local_210);
                    if (iVar3 == '\0') {
                      pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                         ((LocalPointerBase<icu_63::UnicodeSet> *)
                                          &stack0xffffffffffffffd0);
                      addCategory(pUVar5,0x200,
                                  (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                    }
                    else {
                      ConstChar16Ptr::ConstChar16Ptr(&local_218,L"javaIdentifierIgnorable");
                      iVar3 = icu_63::UnicodeString::compare(propName,&local_218,-1);
                      ConstChar16Ptr::~ConstChar16Ptr(&local_218);
                      if (iVar3 == '\0') {
                        pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                           ((LocalPointerBase<icu_63::UnicodeSet> *)
                                            &stack0xffffffffffffffd0);
                        addIdentifierIgnorable
                                  (pUVar5,(UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19)
                                  );
                      }
                      else {
                        ConstChar16Ptr::ConstChar16Ptr(&local_220,L"javaISOControl");
                        iVar3 = icu_63::UnicodeString::compare(propName,&local_220,-1);
                        ConstChar16Ptr::~ConstChar16Ptr(&local_220);
                        if (iVar3 == '\0') {
                          pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                             ((LocalPointerBase<icu_63::UnicodeSet> *)
                                              &stack0xffffffffffffffd0);
                          pUVar5 = UnicodeSet::add(pUVar5,0,0x1f);
                          UnicodeSet::add(pUVar5,0x7f,0x9f);
                        }
                        else {
                          ConstChar16Ptr::ConstChar16Ptr(&local_228,L"javaJavaIdentifierPart");
                          iVar3 = icu_63::UnicodeString::compare(propName,&local_228,-1);
                          ConstChar16Ptr::~ConstChar16Ptr(&local_228);
                          if (iVar3 == '\0') {
                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                               ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                &stack0xffffffffffffffd0);
                            addCategory(pUVar5,0x3e,
                                        (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                               ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                &stack0xffffffffffffffd0);
                            addCategory(pUVar5,0x2000000,
                                        (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                               ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                &stack0xffffffffffffffd0);
                            addCategory(pUVar5,0x400000,
                                        (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                               ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                &stack0xffffffffffffffd0);
                            addCategory(pUVar5,0x200,
                                        (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                               ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                &stack0xffffffffffffffd0);
                            addCategory(pUVar5,0x400,
                                        (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                               ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                &stack0xffffffffffffffd0);
                            addCategory(pUVar5,0x100,
                                        (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                               ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                &stack0xffffffffffffffd0);
                            addCategory(pUVar5,0x40,
                                        (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19));
                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                               ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                &stack0xffffffffffffffd0);
                            addIdentifierIgnorable
                                      (pUVar5,(UErrorCode *)
                                              (setExpr.fUnion.fStackFields.fBuffer + 0x19));
                          }
                          else {
                            ConstChar16Ptr::ConstChar16Ptr(&local_230,L"javaJavaIdentifierStart");
                            iVar3 = icu_63::UnicodeString::compare(propName,&local_230,-1);
                            ConstChar16Ptr::~ConstChar16Ptr(&local_230);
                            if (iVar3 == '\0') {
                              pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                 ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                              addCategory(pUVar5,0x3e,
                                          (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19)
                                         );
                              pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                 ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                              addCategory(pUVar5,0x400,
                                          (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19)
                                         );
                              pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                 ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                              addCategory(pUVar5,0x2000000,
                                          (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19)
                                         );
                              pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                 ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                              addCategory(pUVar5,0x400000,
                                          (UErrorCode *)(setExpr.fUnion.fStackFields.fBuffer + 0x19)
                                         );
                            }
                            else {
                              ConstChar16Ptr::ConstChar16Ptr(&local_238,L"javaLetter");
                              iVar3 = icu_63::UnicodeString::compare(propName,&local_238,-1);
                              ConstChar16Ptr::~ConstChar16Ptr(&local_238);
                              if (iVar3 == '\0') {
                                pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                   ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                    &stack0xffffffffffffffd0);
                                addCategory(pUVar5,0x3e,
                                            (UErrorCode *)
                                            (setExpr.fUnion.fStackFields.fBuffer + 0x19));
                              }
                              else {
                                ConstChar16Ptr::ConstChar16Ptr(&local_240,L"javaLetterOrDigit");
                                iVar3 = icu_63::UnicodeString::compare(propName,&local_240,-1);
                                ConstChar16Ptr::~ConstChar16Ptr(&local_240);
                                if (iVar3 == '\0') {
                                  pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                     ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                      &stack0xffffffffffffffd0);
                                  addCategory(pUVar5,0x3e,
                                              (UErrorCode *)
                                              (setExpr.fUnion.fStackFields.fBuffer + 0x19));
                                  pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                     ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                      &stack0xffffffffffffffd0);
                                  addCategory(pUVar5,0x200,
                                              (UErrorCode *)
                                              (setExpr.fUnion.fStackFields.fBuffer + 0x19));
                                }
                                else {
                                  ConstChar16Ptr::ConstChar16Ptr(&local_248,L"javaLowerCase");
                                  iVar3 = icu_63::UnicodeString::compare(propName,&local_248,-1);
                                  ConstChar16Ptr::~ConstChar16Ptr(&local_248);
                                  if (iVar3 == '\0') {
                                    pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                       ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                        &stack0xffffffffffffffd0);
                                    addCategory(pUVar5,4,(UErrorCode *)
                                                         (setExpr.fUnion.fStackFields.fBuffer + 0x19
                                                         ));
                                  }
                                  else {
                                    ConstChar16Ptr::ConstChar16Ptr(&local_250,L"javaMirrored");
                                    iVar3 = icu_63::UnicodeString::compare(propName,&local_250,-1);
                                    ConstChar16Ptr::~ConstChar16Ptr(&local_250);
                                    if (iVar3 == '\0') {
                                      pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                                         ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                          &stack0xffffffffffffffd0);
                                      UnicodeSet::applyIntPropertyValue
                                                (pUVar5,UCHAR_BIDI_MIRRORED,1,
                                                 (UErrorCode *)
                                                 (setExpr.fUnion.fStackFields.fBuffer + 0x19));
                                    }
                                    else {
                                      ConstChar16Ptr::ConstChar16Ptr(&local_258,L"javaSpaceChar");
                                      iVar3 = icu_63::UnicodeString::compare(propName,&local_258,-1)
                                      ;
                                      ConstChar16Ptr::~ConstChar16Ptr(&local_258);
                                      if (iVar3 == '\0') {
                                        pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                           ((LocalPointerBase<icu_63::UnicodeSet> *)
                                                            &stack0xffffffffffffffd0);
                                        addCategory(pUVar5,0x7000,
                                                    (UErrorCode *)
                                                    (setExpr.fUnion.fStackFields.fBuffer + 0x19));
                                      }
                                      else {
                                        ConstChar16Ptr::ConstChar16Ptr
                                                  (&local_260,L"javaSupplementaryCodePoint");
                                        iVar3 = icu_63::UnicodeString::compare
                                                          (propName,&local_260,-1);
                                        ConstChar16Ptr::~ConstChar16Ptr(&local_260);
                                        if (iVar3 == '\0') {
                                          pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                                             ((LocalPointerBase<icu_63::UnicodeSet>
                                                               *)&stack0xffffffffffffffd0);
                                          UnicodeSet::add(pUVar5,0x10000,0x10ffff);
                                        }
                                        else {
                                          ConstChar16Ptr::ConstChar16Ptr
                                                    (&local_268,L"javaTitleCase");
                                          iVar3 = icu_63::UnicodeString::compare
                                                            (propName,&local_268,-1);
                                          ConstChar16Ptr::~ConstChar16Ptr(&local_268);
                                          if (iVar3 == '\0') {
                                            pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::getAlias
                                                               ((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                            addCategory(pUVar5,8,(UErrorCode *)
                                                                 (setExpr.fUnion.fStackFields.
                                                                  fBuffer + 0x19));
                                          }
                                          else {
                                            ConstChar16Ptr::ConstChar16Ptr
                                                      (&local_270,L"javaUnicodeIdentifierStart");
                                            iVar3 = icu_63::UnicodeString::compare
                                                              (propName,&local_270,-1);
                                            ConstChar16Ptr::~ConstChar16Ptr(&local_270);
                                            if (iVar3 == '\0') {
                                              pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                       getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                              addCategory(pUVar5,0x3e,
                                                          (UErrorCode *)
                                                          (setExpr.fUnion.fStackFields.fBuffer +
                                                          0x19));
                                              pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                       getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                              addCategory(pUVar5,0x400,
                                                          (UErrorCode *)
                                                          (setExpr.fUnion.fStackFields.fBuffer +
                                                          0x19));
                                            }
                                            else {
                                              ConstChar16Ptr::ConstChar16Ptr
                                                        (&local_278,L"javaUnicodeIdentifierPart");
                                              iVar3 = icu_63::UnicodeString::compare
                                                                (propName,&local_278,-1);
                                              ConstChar16Ptr::~ConstChar16Ptr(&local_278);
                                              if (iVar3 == '\0') {
                                                pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                         getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                addCategory(pUVar5,0x3e,
                                                            (UErrorCode *)
                                                            (setExpr.fUnion.fStackFields.fBuffer +
                                                            0x19));
                                                pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                         getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                addCategory(pUVar5,0x400000,
                                                            (UErrorCode *)
                                                            (setExpr.fUnion.fStackFields.fBuffer +
                                                            0x19));
                                                pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                         getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                addCategory(pUVar5,0x200,
                                                            (UErrorCode *)
                                                            (setExpr.fUnion.fStackFields.fBuffer +
                                                            0x19));
                                                pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                         getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                addCategory(pUVar5,0x400,
                                                            (UErrorCode *)
                                                            (setExpr.fUnion.fStackFields.fBuffer +
                                                            0x19));
                                                pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                         getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                addCategory(pUVar5,0x100,
                                                            (UErrorCode *)
                                                            (setExpr.fUnion.fStackFields.fBuffer +
                                                            0x19));
                                                pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                         getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                addCategory(pUVar5,0x40,
                                                            (UErrorCode *)
                                                            (setExpr.fUnion.fStackFields.fBuffer +
                                                            0x19));
                                                pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                         getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                addIdentifierIgnorable
                                                          (pUVar5,(UErrorCode *)
                                                                  (setExpr.fUnion.fStackFields.
                                                                   fBuffer + 0x19));
                                              }
                                              else {
                                                ConstChar16Ptr::ConstChar16Ptr
                                                          (&local_280,L"javaUpperCase");
                                                iVar3 = icu_63::UnicodeString::compare
                                                                  (propName,&local_280,-1);
                                                ConstChar16Ptr::~ConstChar16Ptr(&local_280);
                                                if (iVar3 == '\0') {
                                                  pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                           getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                  addCategory(pUVar5,2,(UErrorCode *)
                                                                       (setExpr.fUnion.fStackFields.
                                                                        fBuffer + 0x19));
                                                }
                                                else {
                                                  ConstChar16Ptr::ConstChar16Ptr
                                                            (&local_288,L"javaValidCodePoint");
                                                  iVar3 = icu_63::UnicodeString::compare
                                                                    (propName,&local_288,-1);
                                                  ConstChar16Ptr::~ConstChar16Ptr(&local_288);
                                                  if (iVar3 == '\0') {
                                                    pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                             operator->((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                  UnicodeSet::add(pUVar5,0,0x10ffff);
                                                  }
                                                  else {
                                                    ConstChar16Ptr::ConstChar16Ptr
                                                              (&local_290,L"javaWhitespace");
                                                    iVar3 = icu_63::UnicodeString::compare
                                                                      (propName,&local_290,-1);
                                                    ConstChar16Ptr::~ConstChar16Ptr(&local_290);
                                                    if (iVar3 == '\0') {
                                                      pUVar5 = LocalPointerBase<icu_63::UnicodeSet>
                                                               ::getAlias((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                  addCategory(pUVar5,0x7000,
                                                              (UErrorCode *)
                                                              (setExpr.fUnion.fStackFields.fBuffer +
                                                              0x19));
                                                  pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                           operator->((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                  UnicodeSet::UnicodeSet(&local_2e8);
                                                  pUVar6 = UnicodeSet::add(&local_2e8,0xa0);
                                                  pUVar6 = UnicodeSet::add(pUVar6,0x2007);
                                                  pUVar6 = UnicodeSet::add(pUVar6,0x202f);
                                                  UnicodeSet::removeAll(pUVar5,pUVar6);
                                                  UnicodeSet::~UnicodeSet(&local_2e8);
                                                  pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::
                                                           operator->((
                                                  LocalPointerBase<icu_63::UnicodeSet> *)
                                                  &stack0xffffffffffffffd0);
                                                  pUVar5 = UnicodeSet::add(pUVar5,9,0xd);
                                                  UnicodeSet::add(pUVar5,0x1c,0x1f);
                                                  }
                                                  else {
                                                    setExpr.fUnion._52_4_ = 0x10304;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  UVar2 = ::U_SUCCESS(setExpr.fUnion._52_4_);
                  if (UVar2 != '\0') {
                    pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                       ((LocalPointerBase<icu_63::UnicodeSet> *)
                                        &stack0xffffffffffffffd0);
                    UVar2 = UnicodeSet::isEmpty(pUVar5);
                    if ((UVar2 == '\0') && ((local_88 & 2) != 0)) {
                      pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                                         ((LocalPointerBase<icu_63::UnicodeSet> *)
                                          &stack0xffffffffffffffd0);
                      UnicodeSet::closeOver(pUVar5,2);
                    }
                  }
                  local_a8 = 2;
                }
                else {
                  local_a8 = 2;
                }
              }
            }
          }
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_118);
        }
      }
    }
    else {
      local_a8 = 2;
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
    UVar2 = ::U_SUCCESS(setExpr.fUnion._52_4_);
    if (UVar2 == '\0') {
      if (setExpr.fUnion._52_4_ == 1) {
        setExpr.fUnion._52_4_ = 0x10304;
      }
      error(this,setExpr.fUnion._52_4_);
      this_local = (RegexCompile *)0x0;
    }
    else {
      if (set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._7_1_ != 0) {
        pUVar5 = LocalPointerBase<icu_63::UnicodeSet>::operator->
                           ((LocalPointerBase<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0);
        UnicodeSet::complement(pUVar5);
      }
      this_local = (RegexCompile *)
                   LocalPointerBase<icu_63::UnicodeSet>::orphan
                             ((LocalPointerBase<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0);
    }
    local_a8 = 1;
    LocalPointer<icu_63::UnicodeSet>::~LocalPointer
              ((LocalPointer<icu_63::UnicodeSet> *)&stack0xffffffffffffffd0);
  }
  else {
    this_local = (RegexCompile *)0x0;
  }
  return (UnicodeSet *)this_local;
}

Assistant:

UnicodeSet *RegexCompile::createSetForProperty(const UnicodeString &propName, UBool negated) {

    if (U_FAILURE(*fStatus)) {
        return nullptr;
    }
    LocalPointer<UnicodeSet> set;
    UErrorCode status = U_ZERO_ERROR;

    do {      // non-loop, exists to allow breaks from the block.
        //
        //  First try the property as we received it
        //
        UnicodeString   setExpr;
        uint32_t        usetFlags = 0;
        setExpr.append(u"[\\p{", -1);
        setExpr.append(propName);
        setExpr.append(u"}]", -1);
        if (fModeFlags & UREGEX_CASE_INSENSITIVE) {
            usetFlags |= USET_CASE_INSENSITIVE;
        }
        set.adoptInsteadAndCheckErrorCode(new UnicodeSet(setExpr, usetFlags, NULL, status), status);
        if (U_SUCCESS(status) || status == U_MEMORY_ALLOCATION_ERROR) {
            break;
        }

        //
        //  The incoming property wasn't directly recognized by ICU.

        //  Check [:word:] and [:all:]. These are not recognized as a properties by ICU UnicodeSet.
        //     Java accepts 'word' with mixed case.
        //     Java accepts 'all' only in all lower case.

        status = U_ZERO_ERROR;
        if (propName.caseCompare(u"word", -1, 0) == 0) {
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(*(fRXPat->fStaticSets[URX_ISWORD_SET])), status);
            break;
        }
        if (propName.compare(u"all", -1) == 0) {
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(0, 0x10ffff), status);
            break;
        }


        //    Do Java InBlock expressions
        //
        UnicodeString mPropName = propName;
        if (mPropName.startsWith(u"In", 2) && mPropName.length() >= 3) {
            status = U_ZERO_ERROR;
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(), status);
            if (U_FAILURE(status)) {
                break;
            }
            UnicodeString blockName(mPropName, 2);  // Property with the leading "In" removed.
            set->applyPropertyAlias(UnicodeString(u"Block"), blockName, status);
            break;
        }

        //  Check for the Java form "IsBooleanPropertyValue", which we will recast
        //  as "BooleanPropertyValue". The property value can be either a
        //  a General Category or a Script Name.

        if (propName.startsWith(u"Is", 2) && propName.length()>=3) {
            mPropName.remove(0, 2);      // Strip the "Is"
            if (mPropName.indexOf(u'=') >= 0) {
                // Reject any "Is..." property expression containing an '=', that is,
                // any non-binary property expression.
                status = U_REGEX_PROPERTY_SYNTAX;
                break;
            }

            if (mPropName.caseCompare(u"assigned", -1, 0) == 0) {
                mPropName.setTo(u"unassigned", -1);
                negated = !negated;
            } else if (mPropName.caseCompare(u"TitleCase", -1, 0) == 0) {
                mPropName.setTo(u"Titlecase_Letter", -1);
            }

            mPropName.insert(0, u"[\\p{", -1);
            mPropName.append(u"}]", -1);
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(mPropName, *fStatus), status);

            if (U_SUCCESS(status) && !set->isEmpty() && (usetFlags & USET_CASE_INSENSITIVE)) {
                set->closeOver(USET_CASE_INSENSITIVE);
            }
            break;

        }

        if (propName.startsWith(u"java", -1)) {
            status = U_ZERO_ERROR;
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(), status);
            if (U_FAILURE(status)) {
                break;
            }
            //
            //  Try the various Java specific properties.
            //   These all begin with "java"
            //
            if (propName.compare(u"javaDefined", -1) == 0) {
                addCategory(set.getAlias(), U_GC_CN_MASK, status);
                set->complement();
            }
            else if (propName.compare(u"javaDigit", -1) == 0) {
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
            }
            else if (propName.compare(u"javaIdentifierIgnorable", -1) == 0) {
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaISOControl", -1) == 0) {
                set->add(0, 0x1F).add(0x7F, 0x9F);
            }
            else if (propName.compare(u"javaJavaIdentifierPart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_SC_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_MC_MASK, status);
                addCategory(set.getAlias(), U_GC_MN_MASK, status);
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaJavaIdentifierStart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_SC_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
            }
            else if (propName.compare(u"javaLetter", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
            }
            else if (propName.compare(u"javaLetterOrDigit", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
            }
            else if (propName.compare(u"javaLowerCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LL_MASK, status);
            }
            else if (propName.compare(u"javaMirrored", -1) == 0) {
                set->applyIntPropertyValue(UCHAR_BIDI_MIRRORED, 1, status);
            }
            else if (propName.compare(u"javaSpaceChar", -1) == 0) {
                addCategory(set.getAlias(), U_GC_Z_MASK, status);
            }
            else if (propName.compare(u"javaSupplementaryCodePoint", -1) == 0) {
                set->add(0x10000, UnicodeSet::MAX_VALUE);
            }
            else if (propName.compare(u"javaTitleCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LT_MASK, status);
            }
            else if (propName.compare(u"javaUnicodeIdentifierStart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
            }
            else if (propName.compare(u"javaUnicodeIdentifierPart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_MC_MASK, status);
                addCategory(set.getAlias(), U_GC_MN_MASK, status);
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaUpperCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LU_MASK, status);
            }
            else if (propName.compare(u"javaValidCodePoint", -1) == 0) {
                set->add(0, UnicodeSet::MAX_VALUE);
            }
            else if (propName.compare(u"javaWhitespace", -1) == 0) {
                addCategory(set.getAlias(), U_GC_Z_MASK, status);
                set->removeAll(UnicodeSet().add(0xa0).add(0x2007).add(0x202f));
                set->add(9, 0x0d).add(0x1c, 0x1f);
            } else {
                status = U_REGEX_PROPERTY_SYNTAX;
            }

            if (U_SUCCESS(status) && !set->isEmpty() && (usetFlags & USET_CASE_INSENSITIVE)) {
                set->closeOver(USET_CASE_INSENSITIVE);
            }
            break;
        }

        // Unrecognized property. ICU didn't like it as it was, and none of the Java compatibility
        // extensions matched it.
        status = U_REGEX_PROPERTY_SYNTAX;
    } while (false);   // End of do loop block. Code above breaks out of the block on success or hard failure.

    if (U_SUCCESS(status)) {
        U_ASSERT(set.isValid());
        if (negated) {
            set->complement();
        }
        return set.orphan();
    } else {
        if (status == U_ILLEGAL_ARGUMENT_ERROR) {
            status = U_REGEX_PROPERTY_SYNTAX;
        }
        error(status);
        return nullptr;
    }
}